

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softhsm2-keyconv.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  char *file_pin;
  int option_index;
  undefined4 local_44;
  char *local_40;
  char *local_38;
  
  local_44 = 0;
  if (argc != 1) {
    local_38 = (char *)0x0;
    local_40 = (char *)0x0;
    pcVar1 = (char *)0x0;
    while( true ) {
      while( true ) {
        do {
          file_pin = pcVar1;
          iVar2 = getopt_long(argc,argv,"hv",long_options,&local_44);
          pcVar1 = _optarg;
        } while (iVar2 == 0x103);
        if (iVar2 < 0x101) {
          if (iVar2 == -1) {
            iVar2 = to_pkcs8(local_40,local_38,file_pin);
            return iVar2;
          }
          if (iVar2 == 0x76) goto LAB_0010285c;
          goto LAB_0010286f;
        }
        if (iVar2 != 0x101) break;
        local_40 = _optarg;
        pcVar1 = file_pin;
      }
      if (iVar2 != 0x102) break;
      local_38 = _optarg;
      pcVar1 = file_pin;
    }
    if (iVar2 == 0x104) {
LAB_0010285c:
      puts("2.6.1");
      goto LAB_00102874;
    }
  }
LAB_0010286f:
  usage();
LAB_00102874:
  exit(0);
}

Assistant:

int main(int argc, char* argv[])
{
	int option_index = 0;
	int opt, result;

	char* in_path = NULL;
	char* out_path = NULL;
	char* file_pin = NULL;

	if (argc == 1)
	{
		usage();
		exit(0);
	}

	while ((opt = getopt_long(argc, argv, "hv", long_options, &option_index)) != -1)
	{
		switch (opt)
		{
			case OPT_IN:
				in_path = optarg;
				break;
			case OPT_OUT:
				out_path = optarg;
				break;
			case OPT_PIN:
				file_pin = optarg;
				break;
			case OPT_VERSION:
			case 'v':
				printf("%s\n", PACKAGE_VERSION);
				exit(0);
				break;
			case OPT_HELP:
			case 'h':
			default:
				usage();
				exit(0);
				break;
		}
	}

	// We should convert to PKCS#8
	result = to_pkcs8(in_path, out_path, file_pin);

	return result;
}